

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCP_USB.cpp
# Opt level: O2

unique_ptr<SuperCardPro,_std::default_delete<SuperCardPro>_> SuperCardProUSB::Open(void)

{
  int iVar1;
  undefined8 *puVar2;
  __uniq_ptr_data<SuperCardPro,_std::default_delete<SuperCardPro>,_true,_true> in_RDI;
  string path;
  
  path._M_dataplus._M_p = (pointer)&path.field_2;
  path._M_string_length = 0;
  path.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)&path);
  if (path._M_string_length != 0) {
    iVar1 = open64(path._M_dataplus._M_p,2);
    if (0 < iVar1) {
      puVar2 = (undefined8 *)operator_new(0x18);
      *(undefined1 *)(puVar2 + 1) = 0;
      *puVar2 = &PTR__SuperCardProUSB_001dd548;
      *(int *)((long)puVar2 + 0xc) = iVar1;
      *(undefined4 *)(puVar2 + 2) = 0;
      goto LAB_00172b65;
    }
  }
  puVar2 = (undefined8 *)0x0;
LAB_00172b65:
  *(undefined8 **)
   in_RDI.super___uniq_ptr_impl<SuperCardPro,_std::default_delete<SuperCardPro>_>._M_t.
   super__Tuple_impl<0UL,_SuperCardPro_*,_std::default_delete<SuperCardPro>_>.
   super__Head_base<0UL,_SuperCardPro_*,_false>._M_head_impl = puVar2;
  std::__cxx11::string::~string((string *)&path);
  return (__uniq_ptr_data<SuperCardPro,_std::default_delete<SuperCardPro>,_true,_true>)
         (tuple<SuperCardPro_*,_std::default_delete<SuperCardPro>_>)
         in_RDI.super___uniq_ptr_impl<SuperCardPro,_std::default_delete<SuperCardPro>_>._M_t.
         super__Tuple_impl<0UL,_SuperCardPro_*,_std::default_delete<SuperCardPro>_>.
         super__Head_base<0UL,_SuperCardPro_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SuperCardPro> SuperCardProUSB::Open()
{
    std::string path;
#ifdef _WIN32
    path = SuperCardProWin32::GetDevicePath();
#elif defined(__linux__)
    path = "/dev/ttyUSB0";
#elif defined(__APPLE__)
    path = "/dev/cu.usbserial-SCP-JIM";
#endif

    if (!path.empty())
    {
        int fd = open(path.c_str(), O_RDWR | O_BINARY);
        if (fd > 0)
        {
#ifdef _WIN32
            DCB dcb = { sizeof(dcb) };
            if (BuildCommDCB("baud=9600 parity=N data=8 stop=1", &dcb))
            {
                HANDLE h = reinterpret_cast<HANDLE>(_get_osfhandle(fd));
                SetCommState(h, &dcb);
            }
#endif
            return std::unique_ptr<SuperCardPro>(new SuperCardProUSB(fd));
        }
    }
    return std::unique_ptr<SuperCardPro>();
}